

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O0

int resolve_any_address(char *ipstr,addrinfo **addresses)

{
  undefined1 local_50 [4];
  int gai_status;
  addrinfo hints;
  addrinfo **addresses_local;
  char *ipstr_local;
  
  hints.ai_next = (addrinfo *)addresses;
  memset(local_50,0,0x30);
  local_50 = (undefined1  [4])0x4;
  hints.ai_flags = 1;
  ipstr_local._4_4_ = getaddrinfo(ipstr,(char *)0x0,(addrinfo *)local_50,(addrinfo **)hints.ai_next)
  ;
  if (ipstr_local._4_4_ == 0) {
    ipstr_local._4_4_ = 0;
  }
  return ipstr_local._4_4_;
}

Assistant:

static int resolve_any_address(const char *ipstr, struct addrinfo **addresses) {
    struct addrinfo hints = {
        .ai_family = AF_UNSPEC,
        .ai_flags = AI_NUMERICHOST,
        // We set ai_socktype so that we only get one result back
        .ai_socktype = SOCK_STREAM};

    int gai_status = getaddrinfo(ipstr, NULL, &hints, addresses);
    if (gai_status) {
        return gai_status;
    }

    return 0;
}